

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::updateRanges
          (CppGenerator *this,size_t depth,string *rel_name,string *attr_name,bool parallel)

{
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R9B;
  string depthString;
  string local_460 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  CppGenerator *in_stack_fffffffffffffbc8;
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [39];
  undefined1 in_stack_fffffffffffffc47;
  size_t in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  CppGenerator *in_stack_fffffffffffffc58;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [39];
  byte local_29;
  string *local_20;
  
  local_29 = in_R9B & 1;
  local_20 = in_RCX;
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffbc8);
  offset_abi_cxx11_(in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  std::__cxx11::string::string(local_400,local_20);
  getUpperPointer(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                  (bool)in_stack_fffffffffffffc47);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::operator+(in_RSI,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  offset_abi_cxx11_(in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::operator+(in_RSI,(char *)in_RDI);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbc0);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc50);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string CppGenerator::updateRanges(size_t depth, const std::string& rel_name,
                                       const std::string& attr_name, bool parallel)
{
    std::string depthString = std::to_string(depth);
    return offset(3+depth)+
        //while statementnd
        "while(upperptr_"+rel_name+"["+depthString+"]<"+
        getUpperPointer(rel_name, depth, parallel)+" && "+
        rel_name+"[upperptr_"+rel_name+"["+depthString+"]+1]."+
        attr_name+" == max_"+attr_name+")\n"+
        //body
        offset(3+depth)+"{\n"+
        offset(4+depth)+"++upperptr_"+rel_name+"["+depthString+"];\n"+
        offset(3+depth)+"}\n";
}